

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader.cpp
# Opt level: O0

FieldType __thiscall HttpFieldMap::getFieldType(HttpFieldMap *this,char *field)

{
  int iVar1;
  int local_24;
  int i;
  char *field_local;
  HttpFieldMap *this_local;
  
  local_24 = 0;
  while( true ) {
    if (0x2e < local_24) {
      return -1;
    }
    iVar1 = strcasecmp(field,gFieldTypeList[local_24]);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return local_24 + 1000;
}

Assistant:

FieldMap::FieldType HttpFieldMap::getFieldType(const char *field) const
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	for (int i = 0; i < kNumFields - FieldMap::kHttpFieldMapStart; ++i)
	{
		if (strcasecmp(field, gFieldTypeList[i]) == 0)
		{
			LOG("type %d, name %s",
				i+FieldMap::kHttpFieldMapStart, gFieldTypeList[i]);
			return (FieldMap::FieldType)i + FieldMap::kHttpFieldMapStart;
		}
	}
	return FieldMap::kInvalidFieldType;
}